

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O2

int get_intv(tbx_t *tbx,kstring_t *str,tbx_intv_t *intv,int is_add)

{
  char cVar1;
  short sVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  
  iVar3 = tbx_parse1(&tbx->conf,(int)str->l,str->s,intv);
  if (iVar3 == 0) {
    cVar1 = *intv->se;
    *intv->se = '\0';
    iVar3 = get_tid(tbx,intv->ss,is_add);
    intv->tid = iVar3;
    pcVar5 = intv->se;
    *pcVar5 = cVar1;
    return (int)pcVar5;
  }
  sVar2 = (short)(tbx->conf).preset;
  pcVar5 = "TBX_GENERIC";
  if (sVar2 == 2) {
    pcVar5 = "TBX_VCF";
  }
  pcVar4 = "TBX_SAM";
  if (sVar2 != 1) {
    pcVar4 = pcVar5;
  }
  iVar3 = fprintf(_stderr,
                  "[E::%s] failed to parse %s, was wrong -p [type] used?\nThe offending line was: \"%s\"\n"
                  ,"get_intv",pcVar4,str->s);
  return iVar3;
}

Assistant:

static inline int get_intv(tbx_t *tbx, kstring_t *str, tbx_intv_t *intv, int is_add)
{
    if (tbx_parse1(&tbx->conf, str->l, str->s, intv) == 0) {
        int c = *intv->se;
        *intv->se = '\0'; intv->tid = get_tid(tbx, intv->ss, is_add); *intv->se = c;
        return (intv->tid >= 0 && intv->beg >= 0 && intv->end >= 0)? 0 : -1;
    } else {
        char *type = NULL;
        switch (tbx->conf.preset&0xffff)
        {
            case TBX_SAM: type = "TBX_SAM"; break;
            case TBX_VCF: type = "TBX_VCF"; break;
            case TBX_UCSC: type = "TBX_UCSC"; break;
            default: type = "TBX_GENERIC"; break;
        }
        fprintf(stderr, "[E::%s] failed to parse %s, was wrong -p [type] used?\nThe offending line was: \"%s\"\n", __func__, type, str->s);
        return -1;
    }
}